

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pytypes.h
# Opt level: O0

string * __thiscall
pybind11::detail::error_fetch_and_normalize::error_string_abi_cxx11_
          (error_fetch_and_normalize *this)

{
  string local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  error_fetch_and_normalize *local_10;
  error_fetch_and_normalize *this_local;
  
  if ((this->m_lazy_error_string_completed & 1U) == 0) {
    local_10 = this;
    format_value_and_trace_abi_cxx11_(&local_50,this);
    std::operator+(&local_30,": ",&local_50);
    std::__cxx11::string::operator+=((string *)&this->m_lazy_error_string,(string *)&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    std::__cxx11::string::~string((string *)&local_50);
    this->m_lazy_error_string_completed = true;
  }
  return &this->m_lazy_error_string;
}

Assistant:

std::string const &error_string() const {
        if (!m_lazy_error_string_completed) {
            m_lazy_error_string += ": " + format_value_and_trace();
            m_lazy_error_string_completed = true;
        }
        return m_lazy_error_string;
    }